

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extents_abandon_vm(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *edata,
                       _Bool growing_retained)

{
  atomic_zu_t *paVar1;
  _Bool _Var2;
  ulong length;
  
  length = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  LOCK();
  paVar1 = &pac->stats->abandoned_vm;
  paVar1->repr = paVar1->repr + length;
  UNLOCK();
  if (ecache->state == extent_state_dirty) {
    _Var2 = extent_purge_lazy_impl(tsdn,ehooks,edata,0,length,growing_retained);
    if (_Var2) {
      extent_purge_forced_impl
                (tsdn,ehooks,edata,0,(edata->field_2).e_size_esn & 0xfffffffffffff000,
                 growing_retained);
    }
  }
  duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
  return;
}

Assistant:

static void
extents_abandon_vm(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *edata, bool growing_retained) {
	size_t sz = edata_size_get(edata);
	if (config_stats) {
		atomic_fetch_add_zu(&pac->stats->abandoned_vm, sz,
		    ATOMIC_RELAXED);
	}
	/*
	 * Leak extent after making sure its pages have already been purged, so
	 * that this is only a virtual memory leak.
	 */
	if (ecache->state == extent_state_dirty) {
		if (extent_purge_lazy_impl(tsdn, ehooks, edata, 0, sz,
		    growing_retained)) {
			extent_purge_forced_impl(tsdn, ehooks, edata, 0,
			    edata_size_get(edata), growing_retained);
		}
	}
	edata_cache_put(tsdn, pac->edata_cache, edata);
}